

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  ParseInfoTree *this_00;
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  ParseInfoTree *pPVar4;
  undefined4 extraout_var;
  Message *pMVar5;
  string *this_01;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  string delimiter;
  MessageFactory *factory;
  
  iVar3 = this->recursion_limit_;
  this->recursion_limit_ = iVar3 + -1;
  if (iVar3 < 1) {
    std::__cxx11::string::string
              ((string *)local_58,"Message is too deep",
               (allocator *)(delimiter.field_2._M_local_buf + 0xf));
    ReportError(this,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    return false;
  }
  this_00 = this->parse_info_tree_;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar4 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar4;
  }
  local_58 = (undefined1  [8])&delimiter._M_string_length;
  delimiter._M_dataplus._M_p = (pointer)0x0;
  delimiter._M_string_length._0_1_ = 0;
  bVar2 = ConsumeMessageDelimiter(this,(string *)local_58);
  if (bVar2) {
    pFVar1 = this->finder_;
    if (pFVar1 == (Finder *)0x0) {
      factory = (MessageFactory *)0x0;
    }
    else {
      iVar3 = (*pFVar1->_vptr_Finder[5])(pFVar1,field);
      factory = (MessageFactory *)CONCAT44(extraout_var,iVar3);
    }
    if (*(int *)(field + 0x3c) == 3) {
      pMVar5 = Reflection::AddMessage(reflection,message,field,factory);
      std::__cxx11::string::string((string *)&local_98,(string *)local_58);
      bVar2 = ConsumeMessage(this,pMVar5,&local_98);
      this_01 = &local_98;
    }
    else {
      pMVar5 = Reflection::MutableMessage(reflection,message,field,factory);
      std::__cxx11::string::string((string *)&local_78,(string *)local_58);
      bVar2 = ConsumeMessage(this,pMVar5,&local_78);
      this_01 = &local_78;
    }
    std::__cxx11::string::~string((string *)this_01);
    if (bVar2 != false) {
      this->recursion_limit_ = this->recursion_limit_ + 1;
      this->parse_info_tree_ = this_00;
      bVar2 = true;
      goto LAB_00316a5d;
    }
  }
  bVar2 = false;
LAB_00316a5d:
  std::__cxx11::string::~string((string *)local_58);
  return bVar2;
}

Assistant:

bool ConsumeFieldMessage(Message* message, const Reflection* reflection,
                           const FieldDescriptor* field) {
    if (--recursion_limit_ < 0) {
      ReportError("Message is too deep");
      return false;
    }
    // If the parse information tree is not nullptr, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != nullptr) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    MessageFactory* factory =
        finder_ ? finder_->FindExtensionFactory(field) : nullptr;
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field, factory),
                        delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field, factory),
                        delimiter));
    }

    ++recursion_limit_;

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }